

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_spacing(nk_context *ctx,int cols)

{
  nk_window *win;
  nk_panel *pnVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  nk_rect none;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4b19,"void nk_spacing(struct nk_context *, int)");
  }
  win = ctx->current;
  if (win == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4b1a,"void nk_spacing(struct nk_context *, int)");
  }
  pnVar1 = win->layout;
  if (pnVar1 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4b1b,"void nk_spacing(struct nk_context *, int)");
  }
  iVar2 = (pnVar1->row).index + cols;
  iVar3 = (pnVar1->row).columns;
  uVar5 = (long)iVar2 / (long)iVar3;
  iVar2 = iVar2 % iVar3;
  iVar3 = (int)uVar5;
  if ((iVar3 != 0) && (cols = iVar2, 0 < iVar3)) {
    uVar5 = uVar5 & 0xffffffff;
    do {
      nk_panel_layout(ctx,win,(win->layout->row).height - (ctx->style).window.spacing.y,
                      (win->layout->row).columns);
      uVar4 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar4;
    } while (uVar4 != 0);
  }
  if ((((pnVar1->row).type & ~NK_LAYOUT_STATIC_FIXED) != NK_LAYOUT_DYNAMIC_FIXED) && (0 < cols)) {
    do {
      nk_panel_alloc_space(&local_40,ctx);
      cols = cols + -1;
    } while (cols != 0);
  }
  (pnVar1->row).index = iVar2;
  return;
}

Assistant:

NK_API void
nk_spacing(struct nk_context *ctx, int cols)
{
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_rect none;
    int i, index, rows;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    /* spacing over row boundaries */
    win = ctx->current;
    layout = win->layout;
    index = (layout->row.index + cols) % layout->row.columns;
    rows = (layout->row.index + cols) / layout->row.columns;
    if (rows) {
        for (i = 0; i < rows; ++i)
            nk_panel_alloc_row(ctx, win);
        cols = index;
    }
    /* non table layout need to allocate space */
    if (layout->row.type != NK_LAYOUT_DYNAMIC_FIXED &&
        layout->row.type != NK_LAYOUT_STATIC_FIXED) {
        for (i = 0; i < cols; ++i)
            nk_panel_alloc_space(&none, ctx);
    } layout->row.index = index;
}